

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.cc
# Opt level: O0

Range * __thiscall re2c::Enc::encodeRange(Enc *this,uint32_t l,uint32_t h)

{
  type_t tVar1;
  uint32_t uVar2;
  Range *pRVar3;
  Range *r2;
  Range *error;
  Range *surrs;
  uint local_30;
  uint32_t ec;
  uint32_t c;
  uint32_t el;
  Range *r;
  uint32_t h_local;
  uint32_t l_local;
  Enc *this_local;
  
  uVar2 = nCodePoints(this);
  if ((l < uVar2) && (uVar2 = nCodePoints(this), h < uVar2)) {
    _c = (Range *)0x0;
    tVar1 = this->type_;
    if (tVar1 == ASCII) {
      _c = Range::ran(l,h + 1);
    }
    else if (tVar1 == EBCDIC) {
      _c = Range::sym(*(uint32_t *)(asc2ebc + (ulong)l * 4));
      for (local_30 = l + 1; local_30 <= h; local_30 = local_30 + 1) {
        pRVar3 = Range::sym(*(uint32_t *)(asc2ebc + (ulong)local_30 * 4));
        _c = Range::add(_c,pRVar3);
      }
    }
    else if (((tVar1 - UCS2 < 4) && (_c = Range::ran(l,h + 1), l < 0xe000)) && (0xd7ff < h)) {
      if (this->policy_ == POLICY_FAIL) {
        _c = (Range *)0x0;
      }
      else if (this->policy_ == POLICY_SUBSTITUTE) {
        pRVar3 = Range::ran(0xd800,0xe000);
        r2 = Range::sym(0xfffd);
        pRVar3 = Range::sub(_c,pRVar3);
        _c = Range::add(pRVar3,r2);
      }
    }
    this_local = (Enc *)_c;
  }
  else {
    this_local = (Enc *)0x0;
  }
  return (Range *)this_local;
}

Assistant:

Range * Enc::encodeRange(uint32_t l, uint32_t h) const
{
	if (l >= nCodePoints () || h >= nCodePoints ())
	{
		return NULL;
	}

	Range * r = NULL;
	switch (type_)
	{
		case ASCII:
			r = Range::ran (l, h + 1);
			break;
		case EBCDIC:
		{
			const uint32_t el = asc2ebc[l];
			r = Range::sym (el);
			for (uint32_t c = l + 1; c <= h; ++c)
			{
				const uint32_t ec = asc2ebc[c];
				r = Range::add (r, Range::sym (ec));
			}
			break;
		}
		case UCS2:
		case UTF16:
		case UTF32:
		case UTF8:
			r = Range::ran (l, h + 1);
			if (l <= SURR_MAX && h >= SURR_MIN)
			{
				switch (policy_)
				{
					case POLICY_FAIL:
						r = NULL;
						break;
					case POLICY_SUBSTITUTE:
					{
						Range * surrs = Range::ran (SURR_MIN, SURR_MAX + 1);
						Range * error = Range::sym (UNICODE_ERROR);
						r = Range::sub (r, surrs);
						r = Range::add (r, error);
						break;
					}
					case POLICY_IGNORE:
						break;
				}
			}
			break;
	}
	return r;
}